

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O3

void __thiscall FreqTable::setTotal(FreqTable *this,double csum)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  if (csum == 0.0) {
    pdVar2 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar2 == pdVar3) {
      iVar6 = 0;
      goto LAB_00111d75;
    }
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    uVar7 = 0;
    auVar10 = vpbroadcastq_avx512f();
    auVar11 = vpsrlq_avx512f(auVar10,3);
    auVar10 = ZEXT864(0) << 0x40;
    do {
      auVar12 = auVar10;
      auVar10 = vpbroadcastq_avx512f();
      auVar10 = vporq_avx512f(auVar10,auVar9);
      uVar5 = vpcmpuq_avx512f(auVar10,auVar11,2);
      pdVar1 = pdVar2 + uVar7;
      auVar10._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * (long)pdVar1[1];
      auVar10._0_8_ = (ulong)((byte)uVar5 & 1) * (long)*pdVar1;
      auVar10._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * (long)pdVar1[2];
      auVar10._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * (long)pdVar1[3];
      auVar10._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * (long)pdVar1[4];
      auVar10._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * (long)pdVar1[5];
      auVar10._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * (long)pdVar1[6];
      auVar10._56_8_ = (uVar5 >> 7) * (long)pdVar1[7];
      uVar7 = uVar7 + 8;
      auVar10 = vaddpd_avx512f(auVar10,auVar12);
    } while ((((ulong)((long)pdVar3 + (-8 - (long)pdVar2)) >> 3) + 8 & 0xfffffffffffffff8) != uVar7)
    ;
    bVar4 = (bool)((byte)uVar5 & 1);
    auVar9._0_8_ = (ulong)bVar4 * auVar10._0_8_ | (ulong)!bVar4 * auVar12._0_8_;
    bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar9._8_8_ = (ulong)bVar4 * auVar10._8_8_ | (ulong)!bVar4 * auVar12._8_8_;
    bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar9._16_8_ = (ulong)bVar4 * auVar10._16_8_ | (ulong)!bVar4 * auVar12._16_8_;
    bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar9._24_8_ = (ulong)bVar4 * auVar10._24_8_ | (ulong)!bVar4 * auVar12._24_8_;
    bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar9._32_8_ = (ulong)bVar4 * auVar10._32_8_ | (ulong)!bVar4 * auVar12._32_8_;
    bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar9._40_8_ = (ulong)bVar4 * auVar10._40_8_ | (ulong)!bVar4 * auVar12._40_8_;
    bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar9._48_8_ = (ulong)bVar4 * auVar10._48_8_ | (ulong)!bVar4 * auVar12._48_8_;
    auVar9._56_8_ = (uVar5 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar12._56_8_;
    auVar8 = vextractf64x4_avx512f(auVar9,1);
    auVar10 = vaddpd_avx512f(auVar9,ZEXT3264(auVar8));
    csum = auVar10._0_8_ + auVar10._16_8_ + auVar10._8_8_ + auVar10._24_8_;
  }
  iVar6 = (int)csum;
LAB_00111d75:
  this->total = iVar6;
  return;
}

Assistant:

void FreqTable::setTotal(double csum=0.0) {
    (static_cast<bool>(csum) ? this -> total = csum : this -> total = accumulate(frequencies.begin(), frequencies.end(), 0.0));
}